

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
basisu::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator=(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *other)

{
  uint32_t uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  uint32_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pSrc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pDst;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  size_t in_stack_ffffffffffffffd8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    if (*(uint32_t *)((long)&in_RDI->_M_string_length + 4) < (uint)in_RSI->_M_string_length) {
      clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      increase_capacity((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        (uint32_t)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0),
                        SUB81((ulong)in_RDI >> 0x10,0));
    }
    else {
      resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             SUB41((uint)in_stack_ffffffffffffffd4 >> 0x18,0));
    }
    for (uVar1 = (uint32_t)in_RSI->_M_string_length; uVar1 != 0; uVar1 = uVar1 - 1) {
      construct<std::__cxx11::string,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_RDI);
    }
    *(uint32_t *)&in_RDI->_M_string_length = (uint32_t)in_RSI->_M_string_length;
    local_8 = in_RDI;
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
         )local_8;
}

Assistant:

inline vector& operator= (const vector& other)
      {
         if (this == &other)
            return *this;

         if (m_capacity >= other.m_size)
            resize(0);
         else
         {
            clear();
            increase_capacity(other.m_size, false);
         }

         if (BASISU_IS_BITWISE_COPYABLE(T))
         {
             if ((m_p) && (other.m_p))
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
         }
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint32_t i = other.m_size; i > 0; i--)
               construct(pDst++, *pSrc++);
         }

         m_size = other.m_size;

         return *this;
      }